

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O2

int __thiscall bdHashSpace::printHashSpace(bdHashSpace *this,ostream *out)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  poVar1 = std::operator<<(out,"bdHashSpace::printHashSpace()");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"--------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->mHashTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mHashTable)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bdHashSet::printHashSet((bdHashSet *)&p_Var2[1]._M_right,out);
  }
  poVar1 = std::operator<<(out,"--------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 1;
}

Assistant:

int     bdHashSpace::printHashSpace(std::ostream &out) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	out << "bdHashSpace::printHashSpace()" << std::endl;
	out << "--------------------------------------------" << std::endl;
	
	for (it = mHashTable.begin(); it != mHashTable.end(); it++) {
		it->second.printHashSet(out);
	}
	out << "--------------------------------------------" << std::endl;
	return 1;
}